

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswConstr.c
# Opt level: O0

int Ssw_ManSweepBmcConstr(Ssw_Man_t *p)

{
  Vec_Ptr_t *pVVar1;
  Ssw_Sat_t *p_00;
  int iVar2;
  uint uVar3;
  int iVar4;
  abctime aVar5;
  Aig_Man_t *pAVar6;
  Aig_Obj_t *pAVar7;
  Aig_Obj_t *pAVar8;
  Aig_Obj_t *pAVar9;
  abctime aVar10;
  abctime clk;
  int local_38;
  int iLits;
  int f;
  int i;
  Aig_Obj_t *pObjLo;
  Aig_Obj_t *pObjLi;
  Aig_Obj_t *pObjNew;
  Aig_Obj_t *pObj;
  Ssw_Man_t *p_local;
  
  aVar5 = Abc_Clock();
  iVar2 = Aig_ManObjNumMax(p->pAig);
  pAVar6 = Aig_ManStart(iVar2 * p->pPars->nFramesK);
  p->pFrames = pAVar6;
  for (iLits = 0; iVar2 = Saig_ManRegNum(p->pAig), iLits < iVar2; iLits = iLits + 1) {
    pVVar1 = p->pAig->vCis;
    iVar2 = Saig_ManPiNum(p->pAig);
    pAVar7 = (Aig_Obj_t *)Vec_PtrEntry(pVVar1,iLits + iVar2);
    pAVar8 = Aig_ManConst0(p->pFrames);
    Ssw_ObjSetFrame(p,pAVar7,0,pAVar8);
  }
  clk._4_4_ = 0;
  p->fRefined = 0;
  for (local_38 = 0; local_38 < p->pPars->nFramesK; local_38 = local_38 + 1) {
    pAVar7 = Aig_ManConst1(p->pAig);
    pAVar8 = Aig_ManConst1(p->pFrames);
    Ssw_ObjSetFrame(p,pAVar7,local_38,pAVar8);
    for (iLits = 0; iVar2 = Saig_ManPiNum(p->pAig), iLits < iVar2; iLits = iLits + 1) {
      pAVar7 = (Aig_Obj_t *)Vec_PtrEntry(p->pAig->vCis,iLits);
      pAVar8 = Aig_ObjCreateCi(p->pFrames);
      uVar3 = Vec_IntEntry(p->vInits,clk._4_4_);
      *(ulong *)&pAVar8->field_0x18 =
           *(ulong *)&pAVar8->field_0x18 & 0xfffffffffffffff7 | ((ulong)uVar3 & 1) << 3;
      Ssw_ObjSetFrame(p,pAVar7,local_38,pAVar8);
      clk._4_4_ = clk._4_4_ + 1;
    }
    for (iLits = 0; iVar2 = Saig_ManPoNum(p->pAig), iLits < iVar2; iLits = iLits + 1) {
      pAVar7 = (Aig_Obj_t *)Vec_PtrEntry(p->pAig->vCos,iLits);
      iVar2 = Saig_ManPoNum(p->pAig);
      iVar4 = Saig_ManConstrNum(p->pAig);
      if (iVar2 - iVar4 <= iLits) {
        pAVar8 = Aig_ObjFanin0(pAVar7);
        pAVar8 = Ssw_ManSweepBmcConstr_rec(p,pAVar8,local_38);
        iVar2 = Aig_ObjFaninC0(pAVar7);
        pAVar7 = Aig_NotCond(pAVar8,iVar2);
        pAVar8 = Aig_Regular(pAVar7);
        pAVar9 = Aig_ManConst1(p->pFrames);
        if (pAVar8 == pAVar9) {
          iVar2 = Aig_IsComplement(pAVar7);
          if (iVar2 == 0) {
            __assert_fail("Aig_IsComplement(pObjNew)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/ssw/sswConstr.c"
                          ,0x214,"int Ssw_ManSweepBmcConstr(Ssw_Man_t *)");
          }
        }
        else {
          pAVar8 = Aig_ManConst0(p->pFrames);
          Ssw_NodesAreConstrained(p,pAVar7,pAVar8);
        }
      }
    }
    for (iLits = 0; iVar2 = Saig_ManRegNum(p->pAig), iLits < iVar2; iLits = iLits + 1) {
      pVVar1 = p->pAig->vCis;
      iVar2 = Saig_ManPiNum(p->pAig);
      pAVar7 = (Aig_Obj_t *)Vec_PtrEntry(pVVar1,iLits + iVar2);
      uVar3 = Ssw_ManSweepNodeConstr(p,pAVar7,local_38,1);
      p->fRefined = uVar3 | p->fRefined;
    }
    for (iLits = 0; iVar2 = Vec_PtrSize(p->pAig->vObjs), iLits < iVar2; iLits = iLits + 1) {
      pAVar7 = (Aig_Obj_t *)Vec_PtrEntry(p->pAig->vObjs,iLits);
      if ((pAVar7 != (Aig_Obj_t *)0x0) && (iVar2 = Aig_ObjIsNode(pAVar7), iVar2 != 0)) {
        pAVar6 = p->pFrames;
        pAVar8 = Ssw_ObjChild0Fra(p,pAVar7,local_38);
        pAVar9 = Ssw_ObjChild1Fra(p,pAVar7,local_38);
        pAVar8 = Aig_And(pAVar6,pAVar8,pAVar9);
        Ssw_ObjSetFrame(p,pAVar7,local_38,pAVar8);
        uVar3 = Ssw_ManSweepNodeConstr(p,pAVar7,local_38,1);
        p->fRefined = uVar3 | p->fRefined;
      }
    }
    if (local_38 == p->pPars->nFramesK + -1) break;
    for (iLits = 0; iVar2 = Vec_PtrSize(p->pAig->vCos), iLits < iVar2; iLits = iLits + 1) {
      pAVar7 = (Aig_Obj_t *)Vec_PtrEntry(p->pAig->vCos,iLits);
      pAVar8 = Ssw_ObjChild0Fra(p,pAVar7,local_38);
      Ssw_ObjSetFrame(p,pAVar7,local_38,pAVar8);
    }
    for (iLits = 0; iVar2 = Saig_ManRegNum(p->pAig), iLits < iVar2; iLits = iLits + 1) {
      pAVar7 = Saig_ManLi(p->pAig,iLits);
      pAVar8 = Saig_ManLo(p->pAig,iLits);
      pAVar7 = Ssw_ObjFrame(p,pAVar7,local_38);
      Ssw_ObjSetFrame(p,pAVar8,local_38 + 1,pAVar7);
      p_00 = p->pMSat;
      pAVar7 = Aig_Regular(pAVar7);
      Ssw_CnfNodeAddToSolver(p_00,pAVar7);
    }
  }
  iVar2 = Vec_IntSize(p->vInits);
  iVar4 = Saig_ManPiNum(p->pAig);
  if (iVar2 == clk._4_4_ + iVar4) {
    aVar10 = Abc_Clock();
    p->timeBmc = (aVar10 - aVar5) + p->timeBmc;
    return p->fRefined;
  }
  __assert_fail("Vec_IntSize(p->vInits) == iLits + Saig_ManPiNum(p->pAig)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/ssw/sswConstr.c"
                ,0x231,"int Ssw_ManSweepBmcConstr(Ssw_Man_t *)");
}

Assistant:

int Ssw_ManSweepBmcConstr( Ssw_Man_t * p )
{
    Aig_Obj_t * pObj, * pObjNew, * pObjLi, * pObjLo;
    int i, f, iLits;
    abctime clk;
clk = Abc_Clock();

    // start initialized timeframes
    p->pFrames = Aig_ManStart( Aig_ManObjNumMax(p->pAig) * p->pPars->nFramesK );
    Saig_ManForEachLo( p->pAig, pObj, i )
        Ssw_ObjSetFrame( p, pObj, 0, Aig_ManConst0(p->pFrames) );

    // build the constraint outputs
    iLits = 0;
    p->fRefined = 0;
    for ( f = 0; f < p->pPars->nFramesK; f++ )
    {
        // map constants and PIs
        Ssw_ObjSetFrame( p, Aig_ManConst1(p->pAig), f, Aig_ManConst1(p->pFrames) );
        Saig_ManForEachPi( p->pAig, pObj, i )
        {
            pObjNew = Aig_ObjCreateCi(p->pFrames);
            pObjNew->fPhase = Vec_IntEntry( p->vInits, iLits++ );
            Ssw_ObjSetFrame( p, pObj, f, pObjNew );
        }
        // build the constraint cones
        Saig_ManForEachPo( p->pAig, pObj, i )
        {
            if ( i < Saig_ManPoNum(p->pAig) - Saig_ManConstrNum(p->pAig) )
                continue;
            pObjNew = Ssw_ManSweepBmcConstr_rec( p, Aig_ObjFanin0(pObj), f );
            pObjNew = Aig_NotCond( pObjNew, Aig_ObjFaninC0(pObj) );
            if ( Aig_Regular(pObjNew) == Aig_ManConst1(p->pFrames) )
            {
                assert( Aig_IsComplement(pObjNew) );
                continue;
            }
            Ssw_NodesAreConstrained( p, pObjNew, Aig_ManConst0(p->pFrames) );
        }        
        // sweep flops
        Saig_ManForEachLo( p->pAig, pObj, i )
            p->fRefined |= Ssw_ManSweepNodeConstr( p, pObj, f, 1 );
        // sweep internal nodes
        Aig_ManForEachNode( p->pAig, pObj, i )
        {
            pObjNew = Aig_And( p->pFrames, Ssw_ObjChild0Fra(p, pObj, f), Ssw_ObjChild1Fra(p, pObj, f) );
            Ssw_ObjSetFrame( p, pObj, f, pObjNew );
            p->fRefined |= Ssw_ManSweepNodeConstr( p, pObj, f, 1 );
        }
        // quit if this is the last timeframe
        if ( f == p->pPars->nFramesK - 1 )
            break;
        // transfer latch input to the latch outputs
        Aig_ManForEachCo( p->pAig, pObj, i )
            Ssw_ObjSetFrame( p, pObj, f, Ssw_ObjChild0Fra(p, pObj, f) );
        // build logic cones for register outputs
        Saig_ManForEachLiLo( p->pAig, pObjLi, pObjLo, i )
        {
            pObjNew = Ssw_ObjFrame( p, pObjLi, f );
            Ssw_ObjSetFrame( p, pObjLo, f+1, pObjNew );
            Ssw_CnfNodeAddToSolver( p->pMSat, Aig_Regular(pObjNew) );//
        }
    }
    assert( Vec_IntSize(p->vInits) == iLits + Saig_ManPiNum(p->pAig) );

    // cleanup
//    Ssw_ClassesCheck( p->ppClasses );
p->timeBmc += Abc_Clock() - clk;
    return p->fRefined;
}